

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter_validation.h
# Opt level: O3

void Image_Function::
     VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
               (ImageTemplate<unsigned_char> *image,ImageTemplate<unsigned_char> *args,
               ImageTemplate<unsigned_char> *args_1)

{
  EVP_PKEY_CTX *src;
  ImageTemplate<unsigned_char> local_40;
  
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(image);
  local_40._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_0011ac30;
  local_40._data = (uchar *)0x0;
  local_40._type = args_1->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_40,(EVP_PKEY_CTX *)args_1,src);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(args);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(&local_40);
  local_40._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_0011ac30;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_40);
  return;
}

Assistant:

void VerifyGrayScaleImage( const TImage & image, Args... args)
    {
        VerifyGrayScaleImage( image );
        VerifyGrayScaleImage( args... );
    }